

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_pipe_send(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  udp_ep *ep;
  nni_msg *m;
  size_t sVar1;
  size_t sVar2;
  undefined1 local_54 [8];
  udp_sp_data dreq;
  size_t local_38;
  
  m = nni_aio_get_msg(aio);
  ep = *arg;
  if (m == (nni_msg *)0x0) {
    local_38 = 0;
  }
  else {
    sVar1 = nni_msg_len(m);
    local_38 = nni_msg_header_len(m);
    local_38 = local_38 + sVar1;
  }
  nni_aio_reset(aio);
  mtx = &ep->mtx;
  nni_mtx_lock(mtx);
  sVar1 = nni_msg_len(m);
  dreq._12_8_ = aio;
  sVar2 = nni_msg_header_len(m);
  if ((ulong)*(ushort *)((long)arg + 0xac) < sVar2 + sVar1) {
    nni_mtx_unlock(mtx);
    nni_aio_finish((nni_aio *)dreq._12_8_,NNG_OK,local_38);
    nni_stat_inc(&ep->st_snd_toobig,1);
    nni_msg_free(m);
    return;
  }
  local_54[0] = '\x01';
  local_54._2_2_ = ep->proto;
  local_54[1] = '\0';
  local_54._4_4_ = *(uint32_t *)((long)arg + 0x9c);
  dreq._0_4_ = *(undefined4 *)((long)arg + 0xa0);
  dreq.us_sender_id = *(uint32_t *)((long)arg + 0xa4);
  *(uint32_t *)((long)arg + 0xa4) = dreq.us_sender_id + 1;
  dreq.us_peer_id._0_2_ = (undefined2)local_38;
  udp_queue_tx(ep,(nng_sockaddr *)((long)arg + 0x10),(udp_sp_msg *)local_54,m);
  nni_mtx_unlock(mtx);
  nni_aio_finish((nni_aio *)dreq._12_8_,NNG_OK,local_38);
  return;
}

Assistant:

static void
udp_pipe_send(void *arg, nni_aio *aio)
{
	udp_pipe   *p = arg;
	udp_ep     *ep;
	udp_sp_data dreq;
	nng_msg    *msg;
	size_t      count = 0;

	msg = nni_aio_get_msg(aio);
	ep  = p->ep;

	if (msg != NULL) {
		count = nni_msg_len(msg) + nni_msg_header_len(msg);
	}

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if ((nni_msg_len(msg) + nni_msg_header_len(msg)) > p->sndmax) {
		nni_mtx_unlock(&ep->mtx);
		// rather failing this with an error, we just drop it on the
		// floor. this is on the sender, so there isn't a compelling
		// need to disconnect the pipe, since it we're not being
		// "ill-behaved" to our peer.
		nni_aio_finish(aio, 0, count);
		nni_stat_inc(&ep->st_snd_toobig, 1);
		nni_msg_free(msg);
		return;
	}

	dreq.us_ver       = 1;
	dreq.us_type      = ep->proto;
	dreq.us_op_code   = OPCODE_DATA;
	dreq.us_sender_id = p->self_id;
	dreq.us_peer_id   = p->peer_id;
	dreq.us_sequence  = p->self_seq++;
	dreq.us_length    = (uint16_t) count;

	// Just queue it, or fail it.
	udp_queue_tx(ep, &p->peer_addr, (void *) &dreq, msg);
	nni_mtx_unlock(&ep->mtx);

	nni_aio_finish(aio, 0, count);
}